

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signpost_intrinsic_triangulation.cpp
# Opt level: O0

Face __thiscall
geometrycentral::surface::SignpostIntrinsicTriangulation::removeInsertedVertex
          (SignpostIntrinsicTriangulation *this,Vertex v)

{
  Vertex e_00;
  Face f;
  bool bVar1;
  SurfacePoint *pSVar2;
  size_t sVar3;
  SignpostIntrinsicTriangulation *in_RDX;
  size_t in_RSI;
  ParentMeshT *in_RDI;
  Edge e;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> __end3;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> __begin3;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> *__range3;
  bool anyFlipped;
  size_t iterCount;
  Face newF;
  ManifoldSurfaceMesh *in_stack_000001c0;
  undefined1 in_stack_000001c8 [16];
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>
  *in_stack_fffffffffffffe78;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>
  *in_stack_fffffffffffffe90;
  ParentMeshT *in_stack_fffffffffffffe98;
  size_t in_stack_fffffffffffffea0;
  NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>
  *in_stack_fffffffffffffee0;
  Vertex *in_stack_ffffffffffffff00;
  Vertex *in_stack_ffffffffffffff70;
  SignpostIntrinsicTriangulation *in_stack_ffffffffffffff78;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
  in_stack_ffffffffffffff80;
  bool local_51;
  NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> *local_50;
  ParentMeshT *pPVar4;
  Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh> local_10;
  
  e_00.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
       in_stack_fffffffffffffea0;
  e_00.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
       in_stack_fffffffffffffe98;
  pPVar4 = in_RDI;
  pSVar2 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfacePoint>::
           operator[](in_stack_fffffffffffffe90,e_00);
  if (pSVar2->type == Vertex) {
    Face::Face((Face *)0x2ca06a);
  }
  else {
    bVar1 = isOnFixedEdge(in_stack_ffffffffffffff78,(Vertex)in_stack_ffffffffffffff80);
    if (bVar1) {
      Face::Face((Face *)0x2ca0bc);
    }
    else {
      local_50 = (NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> *)
                 0x0;
      while (sVar3 = Vertex::degree(in_stack_ffffffffffffff70), sVar3 != 3) {
        local_51 = false;
        Vertex::adjacentEdges(in_stack_ffffffffffffff00);
        NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::begin
                  (in_stack_fffffffffffffee0);
        NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::end
                  ((NavigationSetBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> *)
                   in_RDI);
        while (bVar1 = NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>
                       ::operator!=((NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>
                                     *)in_RDI,in_stack_fffffffffffffe78), bVar1) {
          NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::operator*
                    ((NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>
                      *)0x2ca15d);
          local_51 = flipEdgeIfPossible((SignpostIntrinsicTriangulation *)__begin3.state.currE._0_8_
                                        ,(Edge)__begin3.state.currE.currHe.
                                               super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                                        ,(double)__end3._48_8_);
          if (local_51) break;
          NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>::operator++
                    ((NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator>
                      *)in_RDI);
        }
        if ((local_51 == false) ||
           (in_stack_fffffffffffffe78 = local_50, sVar3 = Vertex::degree(in_stack_ffffffffffffff70),
           (NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> *)
           (sVar3 * 10) < in_stack_fffffffffffffe78)) {
          Face::Face((Face *)0x2ca200);
          return (Face)local_10;
        }
        local_50 = (NavigationIteratorBase<geometrycentral::surface::VertexAdjacentEdgeNavigator> *)
                   &(local_50->state).currE.field_0x1;
      }
      sVar3 = Vertex::degree(in_stack_ffffffffffffff70);
      if (sVar3 == 3) {
        ::std::
        unique_ptr<geometrycentral::surface::ManifoldSurfaceMesh,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
        ::operator->((unique_ptr<geometrycentral::surface::ManifoldSurfaceMesh,_std::default_delete<geometrycentral::surface::ManifoldSurfaceMesh>_>
                      *)0x2ca251);
        local_10 = (Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>)
                   ManifoldSurfaceMesh::removeVertex(in_stack_000001c0,(Vertex)in_stack_000001c8);
        f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
             in_RSI;
        f.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh
             = pPVar4;
        updateFaceBasis(in_RDX,f);
      }
      else {
        Face::Face((Face *)0x2ca23e);
      }
    }
  }
  return (Face)local_10;
}

Assistant:

Face SignpostIntrinsicTriangulation::removeInsertedVertex(Vertex v) {
  // Strategy: flip edges until the vertex has degree three, then remove by replacing with a single face
  // TODO needs a proof that this always works... what about self edges, etc? Seems to work well.

  // What about starting with degree < 3? Since this vertex necessarily has angle sum 2PI, this could only happen in the
  // case of degree 2, with exactly degenerate triangles. Since we assume non-degenerate triangles throughout, we'll
  // consider that to not happen.

  if (vertexLocations[v].type == SurfacePointType::Vertex) return Face(); // can't remove original vertices

  if (isOnFixedEdge(v)) {
    return Face(); // don't try to remove boundary vertices, for now at least
  }

  // Flip edges until
  size_t iterCount = 0;
  while (v.degree() != 3) {

    // Find any edge we can flip
    bool anyFlipped = false;
    for (Edge e : v.adjacentEdges()) {
      anyFlipped = flipEdgeIfPossible(e);
      if (anyFlipped) break;
    }

    // failsafe, in case we get numerically stuck, or there are too many fixed edges (or the algorithm is broken)
    if (!anyFlipped || iterCount > 10 * v.degree()) {
      return Face();
    }

    iterCount++;
  }

  // give up if something went wrong (eg. flipped edges)
  if (v.degree() != 3) return Face();

  // Remove the vertex
  Face newF = intrinsicMesh->removeVertex(v);
  updateFaceBasis(newF);
  return newF;
}